

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

void __thiscall PrintICT::visit(PrintICT *this,CONSTF *node)

{
  ostream *poVar1;
  uint uVar2;
  
  if (this->level != 0) {
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|    ",5);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->level);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"->",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CONSTF",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  poVar1 = std::ostream::_M_insert<double>((double)node->j);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintICT::visit(CONSTF *node) {
    for (unsigned int i = 0; i < this->level; i++)
        std::cout << "|    ";
    std::cout << "->" << "CONSTF" << "." << node->getJ() << std::endl;
}